

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

vec2 djb::brdf::d2_to_u2(vec2 *d)

{
  float_t fVar1;
  float_t fVar2;
  float fVar3;
  float_t fVar4;
  double dVar5;
  vec2 vVar6;
  vec2 local_40;
  vec2 local_38;
  vec2 local_30;
  float local_28;
  float_t local_24;
  float_t b;
  float_t a;
  float_t phi;
  float_t r;
  vec2 *d_local;
  
  _phi = d;
  dVar5 = std::sqrt((double)(ulong)(uint)(d->x * d->x + d->y * d->y));
  a = SUB84(dVar5,0);
  dVar5 = std::atan2((double)(ulong)(uint)_phi->y,(double)(ulong)(uint)_phi->x);
  b = SUB84(dVar5,0);
  fVar1 = m_pi();
  if (SUB84(dVar5,0) < -fVar1 / 4.0) {
    fVar1 = m_pi();
    b = fVar1 + fVar1 + b;
  }
  fVar1 = b;
  fVar2 = m_pi();
  fVar4 = b;
  if (fVar2 / 4.0 <= fVar1) {
    fVar2 = m_pi();
    fVar1 = b;
    if ((fVar2 * 3.0) / 4.0 <= fVar4) {
      fVar2 = m_pi();
      fVar4 = b;
      if ((fVar2 * 5.0) / 4.0 <= fVar1) {
        local_28 = -a;
        fVar1 = m_pi();
        fVar3 = -(fVar4 - (fVar1 * 3.0) / 2.0) * local_28;
        fVar1 = m_pi();
        local_24 = fVar3 / (fVar1 / 4.0);
      }
      else {
        local_24 = -a;
        fVar1 = m_pi();
        fVar3 = (fVar4 - fVar1) * local_24;
        fVar1 = m_pi();
        local_28 = fVar3 / (fVar1 / 4.0);
      }
    }
    else {
      local_28 = a;
      fVar4 = m_pi();
      fVar3 = -(fVar1 - fVar4 / 2.0) * local_28;
      fVar1 = m_pi();
      local_24 = fVar3 / (fVar1 / 4.0);
    }
  }
  else {
    local_24 = a;
    fVar3 = b * a;
    fVar1 = m_pi();
    local_28 = fVar3 / (fVar1 / 4.0);
  }
  vec2::vec2(&local_38,local_24,local_28);
  vec2::vec2(&local_40,1.0);
  local_30 = djb::operator+(&local_38,&local_40);
  vVar6 = djb::operator/(&local_30,2.0);
  return vVar6;
}

Assistant:

vec2 brdf::d2_to_u2(const vec2 &d)
{
	float_t r = sqrt(d.x * d.x + d.y * d.y);
	float_t phi = atan2(d.y, d.x);
	float_t a, b;

	if (phi < -m_pi() / 4) {
		phi += 2 * m_pi();
	}

	if (phi < m_pi() / 4) {
		a = r;
		b = phi * a / (m_pi() / 4);
	} else if (phi < 3 * m_pi() / 4) {
		b = r;
		a = -(phi - m_pi() / 2) * b / (m_pi() / 4);
	} else if (phi < 5 * m_pi() / 4) {
		a = -r;
		b = (phi - m_pi()) * a / (m_pi() / 4);
	} else {
		b = -r;
		a = -(phi - 3 * m_pi() / 2) * b / (m_pi() / 4);
	}

	return (vec2(a, b) + vec2(1)) / 2;
}